

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O1

int Aig_ManVerifyUsingBdds(Aig_Man_t *pInit,Saig_ParBbr_t *pPars)

{
  uint uVar1;
  Abc_Cex_t *pAVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Aig_Man_t *p;
  Vec_Int_t *p_00;
  int *piVar6;
  Abc_Cex_t *pAVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  
  uVar5 = pInit->nTruePis;
  if ((int)uVar5 < 1) {
    uVar10 = 0;
  }
  else {
    uVar11 = pInit->vCis->nSize;
    uVar10 = 0;
    uVar12 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar12 = uVar10;
    }
    do {
      if (uVar12 == uVar10) goto LAB_007d0641;
      if ((*(uint *)((long)pInit->vCis->pArray[uVar10] + 0x18) & 0xffffffc0) == 0)
      goto LAB_007d0406;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
    uVar10 = (ulong)uVar5;
  }
LAB_007d0406:
  if ((uint)uVar10 == uVar5) {
    iVar4 = Aig_ManVerifyUsingBdds_int(pInit,pPars);
    return iVar4;
  }
  p = Aig_ManDupTrim(pInit);
  if (pInit->nObjs[2] <= p->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p) < Aig_ManCiNum(pInit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                  ,0x230,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
  }
  if (p->nRegs != pInit->nRegs) {
    __assert_fail("Aig_ManRegNum(p) == Aig_ManRegNum(pInit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                  ,0x231,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
  }
  iVar4 = Aig_ManVerifyUsingBdds_int(p,pPars);
  if (iVar4 == 0) {
    pAVar2 = p->pSeqModel;
    if (pAVar2 == (Abc_Cex_t *)0x0) {
      __assert_fail("pCexOld != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                    ,0x23a,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
    }
    iVar4 = pInit->nTruePis;
    p_00 = (Vec_Int_t *)malloc(0x10);
    iVar9 = 0x10;
    if (0xe < iVar4 - 1U) {
      iVar9 = iVar4;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar9;
    if (iVar9 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)iVar9 << 2);
    }
    p_00->pArray = piVar6;
    iVar4 = pInit->nTruePis;
    if (0 < iVar4) {
      lVar13 = 0;
      do {
        if (pInit->vCis->nSize <= lVar13) {
LAB_007d0641:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar6 = *(int **)((long)pInit->vCis->pArray[lVar13] + 0x28);
        if (piVar6 == (int *)0x0) {
          iVar4 = -1;
        }
        else {
          if (0xfffffffd < (piVar6[6] & 7U) - 7) {
            __assert_fail("!Aig_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                          ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
          }
          iVar4 = *piVar6;
        }
        Vec_IntPush(p_00,iVar4);
        lVar13 = lVar13 + 1;
        iVar4 = pInit->nTruePis;
      } while (lVar13 < iVar4);
    }
    pAVar7 = Abc_CexAlloc(pInit->nRegs,iVar4,pAVar2->iFrame + 1);
    pAVar7->iFrame = pAVar2->iFrame;
    pAVar7->iPo = pAVar2->iPo;
    if (pAVar2->nRegs < 1) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        if (((uint)(&pAVar2[1].iPo)[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) {
          (&pAVar7[1].iPo)[uVar5 >> 5] = (&pAVar7[1].iPo)[uVar5 >> 5] | 1 << (sbyte)(uVar5 & 0x1f);
        }
        uVar5 = uVar5 + 1;
      } while ((int)uVar5 < pAVar2->nRegs);
    }
    uVar11 = uVar5;
    if (-1 < pAVar7->iFrame) {
      uVar1 = p_00->nSize;
      iVar4 = 0;
      do {
        if (0 < (int)uVar1) {
          piVar6 = p_00->pArray;
          uVar10 = 0;
          do {
            if ((piVar6[uVar10] != -1) &&
               (uVar8 = piVar6[uVar10] + uVar11,
               ((uint)(&pAVar2[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0)) {
              iVar9 = uVar5 + (int)uVar10;
              (&pAVar7[1].iPo)[iVar9 >> 5] =
                   (&pAVar7[1].iPo)[iVar9 >> 5] | 1 << ((byte)iVar9 & 0x1f);
            }
            uVar10 = uVar10 + 1;
          } while (uVar1 != uVar10);
        }
        uVar11 = uVar11 + p->nTruePis;
        uVar5 = uVar5 + pInit->nTruePis;
        bVar3 = iVar4 < pAVar7->iFrame;
        iVar4 = iVar4 + 1;
      } while (bVar3);
    }
    if ((int)uVar5 <= (int)uVar11) {
      __assert_fail("iBitOld < iBitNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                    ,600,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
    }
    if (uVar11 != pAVar2->nBits) {
      __assert_fail("iBitOld == pCexOld->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                    ,0x259,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
    }
    if (uVar5 != pAVar7->nBits) {
      __assert_fail("iBitNew == pCexNew->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/bbr/bbrReach.c"
                    ,0x25a,"int Aig_ManVerifyUsingBdds(Aig_Man_t *, Saig_ParBbr_t *)");
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    pInit->pSeqModel = pAVar7;
    Aig_ManStop(p);
    iVar4 = 0;
  }
  else {
    Aig_ManStop(p);
  }
  return iVar4;
}

Assistant:

int Aig_ManVerifyUsingBdds( Aig_Man_t * pInit, Saig_ParBbr_t * pPars )
{
    Abc_Cex_t * pCexOld, * pCexNew;
    Aig_Man_t * p;
    Aig_Obj_t * pObj;
    Vec_Int_t * vInputMap;
    int i, k, Entry, iBitOld, iBitNew, RetValue;
//    pPars->fVerbose = 1;
    // check if there are PIs without fanout
    Saig_ManForEachPi( pInit, pObj, i )
        if ( Aig_ObjRefs(pObj) == 0 )
            break;
    if ( i == Saig_ManPiNum(pInit) )
        return Aig_ManVerifyUsingBdds_int( pInit, pPars );
    // create new AIG
    p = Aig_ManDupTrim( pInit );
    assert( Aig_ManCiNum(p) < Aig_ManCiNum(pInit) );
    assert( Aig_ManRegNum(p) == Aig_ManRegNum(pInit) );
    RetValue = Aig_ManVerifyUsingBdds_int( p, pPars );
    if ( RetValue != 0 )
    {
        Aig_ManStop( p );
        return RetValue;
    }
    // the problem is satisfiable - remap the pattern
    pCexOld = p->pSeqModel;
    assert( pCexOld != NULL );
    // create input map
    vInputMap = Vec_IntAlloc( Saig_ManPiNum(pInit) );
    Saig_ManForEachPi( pInit, pObj, i )
        if ( pObj->pData != NULL )
            Vec_IntPush( vInputMap, Aig_ObjCioId((Aig_Obj_t *)pObj->pData) );
        else
            Vec_IntPush( vInputMap, -1 );
    // create new pattern
    pCexNew = Abc_CexAlloc( Saig_ManRegNum(pInit), Saig_ManPiNum(pInit), pCexOld->iFrame+1 );
    pCexNew->iFrame = pCexOld->iFrame;
    pCexNew->iPo    = pCexOld->iPo;
    // copy the bit-data
    for ( iBitOld = 0; iBitOld < pCexOld->nRegs; iBitOld++ )
        if ( Abc_InfoHasBit( pCexOld->pData, iBitOld ) )
            Abc_InfoSetBit( pCexNew->pData, iBitOld );
    // copy the primary input data
    iBitNew = iBitOld;
    for ( i = 0; i <= pCexNew->iFrame; i++ )
    {
        Vec_IntForEachEntry( vInputMap, Entry, k )
        {
            if ( Entry == -1 )
                continue;
            if ( Abc_InfoHasBit( pCexOld->pData, iBitOld + Entry ) )
                Abc_InfoSetBit( pCexNew->pData, iBitNew + k );
        }
        iBitOld += Saig_ManPiNum(p);
        iBitNew += Saig_ManPiNum(pInit);
    }
    assert( iBitOld < iBitNew );
    assert( iBitOld == pCexOld->nBits );
    assert( iBitNew == pCexNew->nBits );
    Vec_IntFree( vInputMap );
    pInit->pSeqModel = pCexNew;
    Aig_ManStop( p );
    return 0;
}